

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bid_fx_exception_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::exceptions::BidFXExceptionTest_test_what_works_Test::TestBody
          (BidFXExceptionTest_test_what_works_Test *this)

{
  BidFXException *this_00;
  allocator<char> local_50 [16];
  AssertionResult gtest_ar;
  
  this_00 = (BidFXException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"exception what message works",local_50);
  bidfx_public_api::exceptions::BidFXException::BidFXException(this_00,(string *)&gtest_ar);
  __cxa_throw(this_00,&BidFXException::typeinfo,BidFXException::~BidFXException);
}

Assistant:

TEST(BidFXExceptionTest, test_what_works)
{
    try
    {
        throw BidFXException("exception what message works");
    }
    catch (BidFXException& e)
    {
        EXPECT_STREQ("exception what message works", e.what());
    }

}